

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  service srv;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  basic_test();
  cppcms::service::service(&srv,argc,argv);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(uVar1,local_48,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  local_38._8_8_ = 0;
  local_20 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_28 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_38._M_unused._0_8_ = (undefined8)(function *)&srv;
  cppcms::service::after_fork((function *)&srv);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  cppcms::service::run();
  cppcms::service::~service(&srv);
  return run_ok ^ 1;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		basic_test();
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	return run_ok ? EXIT_SUCCESS : EXIT_FAILURE;
}